

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_ax(REF_INT rows,REF_DBL *a,REF_DBL *x,REF_DBL *ax)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < rows) {
    uVar2 = (ulong)(uint)rows;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    ax[uVar1] = 0.0;
    dVar5 = 0.0;
    pdVar3 = a;
    for (uVar4 = 0; (uint)rows != uVar4; uVar4 = uVar4 + 1) {
      dVar5 = dVar5 + *pdVar3 * x[uVar4];
      ax[uVar1] = dVar5;
      pdVar3 = pdVar3 + rows;
    }
    a = a + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_ax(REF_INT rows, REF_DBL *a, REF_DBL *x,
                                 REF_DBL *ax) {
  REF_INT row, col;

  for (row = 0; row < rows; row++) {
    ax[row] = 0.0;
    for (col = 0; col < rows; col++) {
      ax[row] += a[row + rows * col] * x[col];
    }
  }
  return REF_SUCCESS;
}